

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O2

bool process_arguments(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  int iVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  int iVar6;
  
  iVar6 = 1;
  do {
    if (argc <= iVar6) {
      return true;
    }
    __s2 = (byte *)argv[iVar6];
    bVar1 = *__s2;
    iVar2 = -(bVar1 - 0x2d);
    iVar4 = iVar2;
    if (bVar1 == 0x2d) {
      uVar3 = __s2[1] - 99;
      if (uVar3 == 0) {
        uVar3 = (uint)__s2[2];
      }
      iVar4 = -uVar3;
    }
    if ((iVar4 == 0) && (iVar6 + 1 < argc)) {
      psVar5 = &config_filename_abi_cxx11_;
LAB_00105ade:
      iVar6 = iVar6 + 1;
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      iVar4 = iVar2;
      if (bVar1 != 0x2d) {
LAB_00105a4a:
        if ((iVar4 == 0) && (iVar6 + 1 < argc)) {
          psVar5 = &default_filename_abi_cxx11_;
        }
        else {
          iVar4 = iVar2;
          if (bVar1 == 0x2d) {
            uVar3 = __s2[1] - 0x69;
            if (uVar3 == 0) {
              uVar3 = (uint)__s2[2];
            }
            iVar4 = -uVar3;
          }
          if ((iVar4 != 0) || (argc <= iVar6 + 1)) {
            if (bVar1 == 0x2d) {
              uVar3 = __s2[1] - 0x6c;
              if (uVar3 == 0) {
                uVar3 = (uint)__s2[2];
              }
              iVar2 = -uVar3;
            }
            if ((iVar2 != 0) || (argc <= iVar6 + 1)) {
              iVar4 = strcmp("--pidfile",(char *)__s2);
              if ((iVar4 != 0) || (argc <= iVar6 + 1)) goto LAB_00105aef;
              psVar5 = &pid_filename_abi_cxx11_;
              goto LAB_00105ade;
            }
          }
          psVar5 = &interface_name_abi_cxx11_;
        }
        goto LAB_00105ade;
      }
      uVar3 = __s2[1] - 0x44;
      if (uVar3 == 0) {
        uVar3 = (uint)__s2[2];
      }
      if (uVar3 != 0) {
        uVar3 = __s2[1] - 100;
        if (uVar3 == 0) {
          uVar3 = (uint)__s2[2];
        }
        iVar4 = -uVar3;
        goto LAB_00105a4a;
      }
      daemonize = true;
    }
LAB_00105aef:
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool process_arguments(int argc, char** argv)
{
  // Loop over all the arguments, and process them
  for (int arg = 1; arg < argc; arg++)
  {
    // Argument -c specifies the config file filename
    if (strcmp("-c", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      config_filename = argv[arg];
    }
    // Argument -D indicates this process should daemonize itself
    else if (strcmp("-D", argv[arg]) == 0)
    {
      daemonize = true;
    }
    // Argument -d specifies the default file filename
    else if (strcmp("-d", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      default_filename = argv[arg];
    }
    // Argument -i specifies an interface to monitor
    else if (strcmp("-i", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    // Argument -l specifies the log file filename
    else if (strcmp("-l", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      interface_name = argv[arg];
    }
    else if (strcmp("--pidfile", argv[arg]) == 0 && arg + 1 < argc)
    {
      arg++;

      pid_filename = argv[arg];
    }

  }

  // If execution reaches here there was an acceptable set of arguments provided
  return true;
}